

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<CPP::WriteInitialization::Buddy>::copyAppend
          (QGenericArrayOps<CPP::WriteInitialization::Buddy> *this,Buddy *b,Buddy *e)

{
  Buddy *pBVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pBVar1 = (this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).ptr;
    lVar3 = (this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).size;
    do {
      pDVar2 = (b->labelVarName).d.d;
      pBVar1[lVar3].labelVarName.d.d = pDVar2;
      pBVar1[lVar3].labelVarName.d.ptr = (b->labelVarName).d.ptr;
      pBVar1[lVar3].labelVarName.d.size = (b->labelVarName).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar2 = (b->buddyAttributeName).d.d;
      pBVar1[lVar3].buddyAttributeName.d.d = pDVar2;
      pBVar1[lVar3].buddyAttributeName.d.ptr = (b->buddyAttributeName).d.ptr;
      pBVar1[lVar3].buddyAttributeName.d.size = (b->buddyAttributeName).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar3 = (this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).size + 1;
      (this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }